

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinImporter::ReadBinaryMesh(AssbinImporter *this,IOStream *stream,aiMesh *mesh)

{
  aiFace *paVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  aiColor4t<float> *out;
  aiVector3t<float> *paVar5;
  aiBone **ppaVar6;
  aiBone *this_00;
  ulong *puVar7;
  aiFace *paVar8;
  uint *puVar9;
  DeadlyImportError *this_01;
  AssbinImporter *pAVar10;
  uint n;
  long lVar11;
  ulong uVar12;
  uint a;
  ulong uVar13;
  uint i;
  allocator local_59;
  AssbinImporter *local_58;
  string local_50;
  
  uVar3 = Read<unsigned_int>(stream);
  if (uVar3 == 0x1237) {
    Read<unsigned_int>(stream);
    uVar3 = Read<unsigned_int>(stream);
    mesh->mPrimitiveTypes = uVar3;
    uVar3 = Read<unsigned_int>(stream);
    mesh->mNumVertices = uVar3;
    uVar3 = Read<unsigned_int>(stream);
    mesh->mNumFaces = uVar3;
    uVar3 = Read<unsigned_int>(stream);
    mesh->mNumBones = uVar3;
    uVar3 = Read<unsigned_int>(stream);
    mesh->mMaterialIndex = uVar3;
    uVar3 = Read<unsigned_int>(stream);
    if ((uVar3 & 1) != 0) {
      uVar4 = mesh->mNumVertices;
      uVar13 = (ulong)uVar4 * 0xc;
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar13,1);
      }
      else {
        paVar5 = (aiVector3t<float> *)operator_new__(uVar13);
        if (uVar4 != 0) {
          memset(paVar5,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
        }
        mesh->mVertices = paVar5;
        ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
      }
    }
    if ((uVar3 & 2) != 0) {
      uVar4 = mesh->mNumVertices;
      uVar13 = (ulong)uVar4 * 0xc;
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar13,1);
      }
      else {
        paVar5 = (aiVector3t<float> *)operator_new__(uVar13);
        if (uVar4 != 0) {
          memset(paVar5,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
        }
        mesh->mNormals = paVar5;
        ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
      }
    }
    local_58 = this;
    if ((uVar3 & 4) != 0) {
      uVar4 = mesh->mNumVertices;
      uVar13 = (ulong)uVar4 * 0xc;
      if (this->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar13,1);
        (*stream->_vptr_IOStream[4])(stream,(ulong)mesh->mNumVertices * 0xc,1);
      }
      else {
        paVar5 = (aiVector3t<float> *)operator_new__(uVar13);
        if (uVar4 != 0) {
          memset(paVar5,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
        }
        mesh->mTangents = paVar5;
        ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
        uVar4 = mesh->mNumVertices;
        uVar13 = (ulong)uVar4 * 0xc;
        paVar5 = (aiVector3t<float> *)operator_new__(uVar13);
        if ((ulong)uVar4 != 0) {
          uVar13 = uVar13 - 0xc;
          memset(paVar5,0,(uVar13 - uVar13 % 0xc) + 0xc);
        }
        mesh->mBitangents = paVar5;
        ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
      }
    }
    lVar11 = 0;
    while ((lVar11 != 8 && (((uVar3 >> ((byte)lVar11 & 0x1f)) >> 0x10 & 1) != 0))) {
      uVar4 = mesh->mNumVertices;
      uVar13 = (ulong)uVar4 << 4;
      if (local_58->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar13,1);
      }
      else {
        out = (aiColor4t<float> *)operator_new__(uVar13);
        if (uVar4 != 0) {
          memset(out,0,uVar13);
        }
        mesh->mColors[lVar11] = out;
        ReadArray<aiColor4t<float>>(stream,out,uVar4);
      }
      lVar11 = lVar11 + 1;
    }
    lVar11 = 0;
    pAVar10 = local_58;
    while ((lVar11 != 8 && (((uVar3 >> ((byte)lVar11 & 0x1f)) >> 8 & 1) != 0))) {
      uVar4 = Read<unsigned_int>(stream);
      mesh->mNumUVComponents[lVar11] = uVar4;
      uVar4 = mesh->mNumVertices;
      uVar13 = (ulong)uVar4 * 0xc;
      if (pAVar10->shortened == true) {
        (*stream->_vptr_IOStream[4])(stream,uVar13,1);
      }
      else {
        paVar5 = (aiVector3t<float> *)operator_new__(uVar13);
        if (uVar4 != 0) {
          memset(paVar5,0,((uVar13 - 0xc) - (uVar13 - 0xc) % 0xc) + 0xc);
        }
        mesh->mTextureCoords[lVar11] = paVar5;
        ReadArray<aiVector3t<float>>(stream,paVar5,uVar4);
        pAVar10 = local_58;
      }
      lVar11 = lVar11 + 1;
    }
    if (pAVar10->shortened == true) {
      Read<unsigned_int>(stream);
    }
    else {
      uVar13 = (ulong)mesh->mNumFaces;
      puVar7 = (ulong *)operator_new__(uVar13 * 0x10 + 8);
      paVar1 = (aiFace *)(puVar7 + 1);
      *puVar7 = uVar13;
      if (uVar13 != 0) {
        paVar8 = paVar1;
        do {
          paVar8->mNumIndices = 0;
          paVar8->mIndices = (uint *)0x0;
          paVar8 = paVar8 + 1;
        } while (paVar8 != paVar1 + uVar13);
      }
      mesh->mFaces = paVar1;
      for (uVar12 = 0; uVar12 < uVar13; uVar12 = uVar12 + 1) {
        paVar1 = mesh->mFaces;
        uVar2 = Read<unsigned_short>(stream);
        paVar1[uVar12].mNumIndices = (uint)uVar2;
        puVar9 = (uint *)operator_new__((ulong)uVar2 << 2);
        paVar1[uVar12].mIndices = puVar9;
        for (uVar13 = 0; uVar13 < paVar1[uVar12].mNumIndices; uVar13 = uVar13 + 1) {
          if (mesh->mNumVertices < 0x10000) {
            uVar2 = Read<unsigned_short>(stream);
            uVar3 = (uint)uVar2;
          }
          else {
            uVar3 = Read<unsigned_int>(stream);
          }
          paVar1[uVar12].mIndices[uVar13] = uVar3;
        }
        uVar13 = (ulong)mesh->mNumFaces;
      }
    }
    pAVar10 = local_58;
    uVar13 = (ulong)mesh->mNumBones;
    if (uVar13 != 0) {
      ppaVar6 = (aiBone **)operator_new__(uVar13 << 3);
      mesh->mBones = ppaVar6;
      for (uVar12 = 0; uVar12 < uVar13; uVar12 = uVar12 + 1) {
        this_00 = (aiBone *)operator_new(0x450);
        aiBone::aiBone(this_00);
        mesh->mBones[uVar12] = this_00;
        ReadBinaryBone(pAVar10,stream,mesh->mBones[uVar12]);
        uVar13 = (ulong)mesh->mNumBones;
      }
    }
    return;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_50,"Magic chunk identifiers are wrong!",&local_59);
  DeadlyImportError::DeadlyImportError(this_01,&local_50);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssbinImporter::ReadBinaryMesh( IOStream * stream, aiMesh* mesh ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AIMESH)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    mesh->mPrimitiveTypes = Read<unsigned int>(stream);
    mesh->mNumVertices = Read<unsigned int>(stream);
    mesh->mNumFaces = Read<unsigned int>(stream);
    mesh->mNumBones = Read<unsigned int>(stream);
    mesh->mMaterialIndex = Read<unsigned int>(stream);

    // first of all, write bits for all existent vertex components
    unsigned int c = Read<unsigned int>(stream);

    if (c & ASSBIN_MESH_HAS_POSITIONS) {
        if (shortened) {
            ReadBounds(stream,mesh->mVertices,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mVertices = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mVertices,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_NORMALS) {
        if (shortened) {
            ReadBounds(stream,mesh->mNormals,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mNormals = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mNormals,mesh->mNumVertices);
        }
    }
    if (c & ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS) {
        if (shortened) {
            ReadBounds(stream,mesh->mTangents,mesh->mNumVertices);
            ReadBounds(stream,mesh->mBitangents,mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTangents,mesh->mNumVertices);
            mesh->mBitangents = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mBitangents,mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
        if (!(c & ASSBIN_MESH_HAS_COLOR(n))) {
            break;
        }

        if (shortened) {
            ReadBounds(stream,mesh->mColors[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mColors[n] = new aiColor4D[mesh->mNumVertices];
            ReadArray<aiColor4D>(stream,mesh->mColors[n],mesh->mNumVertices);
        }
    }
    for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
        if (!(c & ASSBIN_MESH_HAS_TEXCOORD(n))) {
            break;
        }

        // write number of UV components
        mesh->mNumUVComponents[n] = Read<unsigned int>(stream);

        if (shortened) {
            ReadBounds(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }  else {
            // else write as usual
            mesh->mTextureCoords[n] = new aiVector3D[mesh->mNumVertices];
            ReadArray<aiVector3D>(stream,mesh->mTextureCoords[n],mesh->mNumVertices);
        }
    }

    // write faces. There are no floating-point calculations involved
    // in these, so we can write a simple hash over the face data
    // to the dump file. We generate a single 32 Bit hash for 512 faces
    // using Assimp's standard hashing function.
    if (shortened) {
        Read<unsigned int>(stream);
    } else  {
        // else write as usual
        // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
            aiFace& f = mesh->mFaces[i];

            static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
            f.mNumIndices = Read<uint16_t>(stream);
            f.mIndices = new unsigned int[f.mNumIndices];

            for (unsigned int a = 0; a < f.mNumIndices;++a) {
                // Check if unsigned  short ( 16 bit  ) are big enought for the indices
                if ( fitsIntoUI16( mesh->mNumVertices ) ) {
                    f.mIndices[a] = Read<uint16_t>(stream);
                } else {
                    f.mIndices[a] = Read<unsigned int>(stream);
                }
            }
        }
    }

    // write bones
    if (mesh->mNumBones) {
        mesh->mBones = new C_STRUCT aiBone*[mesh->mNumBones];
        for (unsigned int a = 0; a < mesh->mNumBones;++a) {
            mesh->mBones[a] = new aiBone();
            ReadBinaryBone(stream,mesh->mBones[a]);
        }
    }
}